

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O2

int __thiscall
gl4cts::StandardPageSizesTestCase::init(StandardPageSizesTestCase *this,EVP_PKEY_CTX *ctx)

{
  vector<int,_std::allocator<int>_> *this_00;
  mapped_type *pmVar1;
  map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
  *this_01;
  int local_24;
  
  this_00 = &this->mSupportedTargets;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_24);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_24);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_24);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_24);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_24);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_24);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_24);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_24);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_24);
  this_01 = &this->mStandardVirtualPageSizesTable;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x100;
  pmVar1->ySize = 0x100;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x100;
  pmVar1->ySize = 0x100;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x100;
  pmVar1->ySize = 0x100;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x100;
  pmVar1->ySize = 0x100;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x100;
  pmVar1->ySize = 0x80;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x100;
  pmVar1->ySize = 0x80;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x100;
  pmVar1->ySize = 0x80;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x100;
  pmVar1->ySize = 0x80;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x100;
  pmVar1->ySize = 0x80;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x100;
  pmVar1->ySize = 0x80;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x100;
  pmVar1->ySize = 0x80;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x100;
  pmVar1->ySize = 0x80;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x100;
  pmVar1->ySize = 0x80;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x100;
  pmVar1->ySize = 0x80;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x80;
  pmVar1->ySize = 0x80;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x80;
  pmVar1->ySize = 0x80;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x80;
  pmVar1->ySize = 0x80;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x80;
  pmVar1->ySize = 0x80;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x80;
  pmVar1->ySize = 0x80;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x80;
  pmVar1->ySize = 0x80;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x80;
  pmVar1->ySize = 0x80;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x80;
  pmVar1->ySize = 0x80;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x80;
  pmVar1->ySize = 0x80;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x80;
  pmVar1->ySize = 0x80;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x80;
  pmVar1->ySize = 0x80;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x80;
  pmVar1->ySize = 0x80;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x80;
  pmVar1->ySize = 0x80;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x80;
  pmVar1->ySize = 0x80;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x80;
  pmVar1->ySize = 0x80;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x80;
  pmVar1->ySize = 0x80;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x80;
  pmVar1->ySize = 0x40;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x80;
  pmVar1->ySize = 0x40;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x80;
  pmVar1->ySize = 0x40;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x80;
  pmVar1->ySize = 0x40;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x80;
  pmVar1->ySize = 0x40;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x80;
  pmVar1->ySize = 0x40;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x80;
  pmVar1->ySize = 0x40;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x80;
  pmVar1->ySize = 0x40;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x40;
  pmVar1->ySize = 0x40;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x40;
  pmVar1->ySize = 0x40;
  pmVar1->zSize = 1;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](this_01,&local_24);
  pmVar1->xSize = 0x40;
  pmVar1->ySize = 0x40;
  pmVar1->zSize = 1;
  return (int)pmVar1;
}

Assistant:

void StandardPageSizesTestCase::init()
{
	mSupportedTargets.push_back(GL_TEXTURE_1D);
	mSupportedTargets.push_back(GL_TEXTURE_1D_ARRAY);
	mSupportedTargets.push_back(GL_TEXTURE_2D);
	mSupportedTargets.push_back(GL_TEXTURE_2D_ARRAY);
	mSupportedTargets.push_back(GL_TEXTURE_CUBE_MAP);
	mSupportedTargets.push_back(GL_TEXTURE_CUBE_MAP_ARRAY);
	mSupportedTargets.push_back(GL_TEXTURE_RECTANGLE);
	mSupportedTargets.push_back(GL_TEXTURE_BUFFER);
	mSupportedTargets.push_back(GL_RENDERBUFFER);

	mStandardVirtualPageSizesTable[GL_R8]			  = PageSizeStruct(256, 256, 1);
	mStandardVirtualPageSizesTable[GL_R8_SNORM]		  = PageSizeStruct(256, 256, 1);
	mStandardVirtualPageSizesTable[GL_R8I]			  = PageSizeStruct(256, 256, 1);
	mStandardVirtualPageSizesTable[GL_R8UI]			  = PageSizeStruct(256, 256, 1);
	mStandardVirtualPageSizesTable[GL_R16]			  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_R16_SNORM]	  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_RG8]			  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_RG8_SNORM]	  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_RGB565]		  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_R16F]			  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_R16I]			  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_R16UI]		  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_RG8I]			  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_RG8UI]		  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_RG16]			  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RG16_SNORM]	 = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RGBA8]		  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RGBA8_SNORM]	= PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RGB10_A2]		  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RGB10_A2UI]	 = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RG16F]		  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_R32F]			  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_R11F_G11F_B10F] = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RGB9_E5]		  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_R32I]			  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_R32UI]		  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RG16I]		  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RG16UI]		  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RGBA8I]		  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RGBA8UI]		  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RGBA16]		  = PageSizeStruct(128, 64, 1);
	mStandardVirtualPageSizesTable[GL_RGBA16_SNORM]   = PageSizeStruct(128, 64, 1);
	mStandardVirtualPageSizesTable[GL_RGBA16F]		  = PageSizeStruct(128, 64, 1);
	mStandardVirtualPageSizesTable[GL_RG32F]		  = PageSizeStruct(128, 64, 1);
	mStandardVirtualPageSizesTable[GL_RG32I]		  = PageSizeStruct(128, 64, 1);
	mStandardVirtualPageSizesTable[GL_RG32UI]		  = PageSizeStruct(128, 64, 1);
	mStandardVirtualPageSizesTable[GL_RGBA16I]		  = PageSizeStruct(128, 64, 1);
	mStandardVirtualPageSizesTable[GL_RGBA16UI]		  = PageSizeStruct(128, 64, 1);
	mStandardVirtualPageSizesTable[GL_RGBA32F]		  = PageSizeStruct(64, 64, 1);
	mStandardVirtualPageSizesTable[GL_RGBA32I]		  = PageSizeStruct(64, 64, 1);
	mStandardVirtualPageSizesTable[GL_RGBA32UI]		  = PageSizeStruct(64, 64, 1);
}